

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multisig_tests.cpp
# Opt level: O1

void __thiscall multisig_tests::multisig_Sign::test_method(multisig_Sign *this)

{
  uint uVar1;
  ulong *puVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  CScript *pCVar7;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar8;
  pointer *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar9;
  iterator in_R8;
  iterator in_R9;
  int i;
  CKey *pCVar10;
  uchar *in;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  CMutableTransaction txFrom;
  SignatureData empty;
  CMutableTransaction txTo [3];
  CScript escrow;
  CScript a_or_b;
  CScript a_and_b;
  CKey key [4];
  FillableSigningProvider keystore;
  check_type cVar11;
  char *local_720;
  char *local_718;
  undefined1 local_710 [16];
  pointer local_700;
  string *local_6f8;
  assertion_result local_6f0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  int local_6b4;
  CMutableTransaction local_6b0;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  string local_648;
  CTransaction local_628;
  undefined1 local_5a8 [200];
  _Rb_tree_node_base local_4e0;
  size_t local_4c0;
  bool local_450;
  _Rb_tree_node_base local_440;
  size_t local_420;
  _Rb_tree_node_base local_410;
  size_t local_3f0;
  pointer puStack_3e8;
  pointer local_3e0;
  pointer puStack_3d8;
  _Rb_tree_node_base local_3c8;
  size_t local_3a8;
  _Rb_tree_node_base local_398;
  size_t local_378;
  _Rb_tree_node_base local_368;
  size_t local_348;
  pointer pCStack_340;
  pointer local_338;
  pointer pCStack_330;
  pointer local_328;
  pointer pCStack_320;
  pointer local_318;
  uchar auStack_310 [64];
  _Rb_tree_node_base local_2d0;
  size_t local_2b0;
  _Rb_tree_node_base local_2a0;
  size_t local_280;
  _Rb_tree_node_base local_270;
  size_t local_250;
  _Rb_tree_node_base local_240;
  size_t local_220;
  undefined1 local_218 [16];
  shared_count asStack_208 [15];
  pointer local_190 [5];
  undefined1 local_168 [28];
  uint uStack_14c;
  undefined1 local_148 [28];
  uint uStack_12c;
  undefined1 local_128 [28];
  uint uStack_10c;
  CKey local_108 [4];
  SigningProvider local_c8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_c0;
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  local_90;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c8._vptr_SigningProvider = (_func_int **)&PTR__FillableSigningProvider_013e4e20;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58 = 0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_60 = 0;
  local_48 = 0;
  uStack_40 = 0;
  uStack_50 = 1;
  lVar6 = 8;
  do {
    *(undefined1 *)((long)local_108 + lVar6 + -8) = 0;
    *(undefined8 *)(&local_108[0].fCompressed + lVar6) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x48);
  lVar6 = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pCVar10 = (CKey *)(&local_108[0].fCompressed + lVar6);
    CKey::MakeNewKey(pCVar10,true);
    local_658 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_650 = "";
    local_668 = &boost::unit_test::basic_cstring<char_const>::null;
    local_660 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0xbe;
    file.m_begin = (iterator)&local_658;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_668,msg);
    CKey::GetPubKey((CPubKey *)local_5a8,pCVar10);
    iVar5 = (*local_c8._vptr_SigningProvider[10])(&local_c8,pCVar10,(lazy_ostream *)local_5a8);
    local_218[0] = SUB41(iVar5,0);
    local_218._8_8_ = (element_type *)0x0;
    asStack_208[0].pi_ = (sp_counted_base *)0x0;
    local_628.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xed8cf4;
    local_628.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xed8d0b;
    local_5a8[8] = false;
    local_5a8._0_8_ = &PTR__lazy_ostream_013d3df0;
    local_5a8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_678 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_670 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    local_5a8._24_8_ = &local_628;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_218,(lazy_ostream *)local_5a8,1,0,WARN,_cVar11,
               (size_t)&local_678,0xbe);
    boost::detail::shared_count::~shared_count(asStack_208);
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  local_128._16_8_ = 0;
  stack0xfffffffffffffef0 = 0;
  local_128._0_8_ = (char *)0x0;
  local_128._8_8_ = 0;
  local_5a8[0] = 0x52;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_128,(iterator)local_128,
             local_5a8);
  CKey::GetPubKey((CPubKey *)local_5a8,local_108);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_628,
             (CPubKey *)local_5a8);
  pCVar7 = CScript::operator<<((CScript *)local_128,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_628);
  pCVar10 = local_108 + 1;
  CKey::GetPubKey((CPubKey *)local_218,pCVar10);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_6b0,
             (CPubKey *)local_218);
  ppVar8 = &CScript::operator<<(pCVar7,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &local_6b0)->super_CScriptBase;
  uVar1 = ppVar8->_size;
  uVar4 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar4 = uVar1;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar8->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar9 = ppVar8;
  }
  local_148[0] = 'R';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar9->_union + (long)(int)uVar4),local_148);
  uVar1 = ppVar8->_size;
  uVar4 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar4 = uVar1;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar8->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar9 = ppVar8;
  }
  local_148[0] = 0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar9->_union + (long)(int)uVar4),(uchar *)local_148);
  if (local_6b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_6b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_628.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_628.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_628.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_628.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_148._16_8_ = 0;
  stack0xfffffffffffffed0 = 0;
  local_148._0_8_ = (char *)0x0;
  local_148._8_8_ = 0;
  local_5a8[0] = 0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148,(iterator)local_148,
             local_5a8);
  CKey::GetPubKey((CPubKey *)local_5a8,local_108);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_628,
             (CPubKey *)local_5a8);
  pCVar7 = CScript::operator<<((CScript *)local_148,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_628);
  CKey::GetPubKey((CPubKey *)local_218,pCVar10);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_6b0,
             (CPubKey *)local_218);
  ppVar8 = &CScript::operator<<(pCVar7,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &local_6b0)->super_CScriptBase;
  uVar1 = ppVar8->_size;
  uVar4 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar4 = uVar1;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar8->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar9 = ppVar8;
  }
  local_168[0] = 'R';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar9->_union + (long)(int)uVar4),local_168);
  uVar1 = ppVar8->_size;
  uVar4 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar4 = uVar1;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar8->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar9 = ppVar8;
  }
  local_168[0] = 0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar9->_union + (long)(int)uVar4),(uchar *)local_168);
  if (local_6b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_6b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_628.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_628.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_628.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_628.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_168._16_8_ = 0;
  stack0xfffffffffffffeb0 = 0;
  local_168._0_8_ = (char *)0x0;
  local_168._8_8_ = 0;
  local_5a8[0] = 0x52;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,(iterator)local_168,
             local_5a8);
  CKey::GetPubKey((CPubKey *)local_5a8,local_108);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_6b0,
             (CPubKey *)local_5a8);
  pCVar7 = CScript::operator<<((CScript *)local_168,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_6b0);
  CKey::GetPubKey((CPubKey *)local_218,pCVar10);
  in = local_218;
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_710,(CPubKey *)in);
  pCVar7 = CScript::operator<<(pCVar7,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_710);
  CKey::GetPubKey((CPubKey *)&local_628,local_108 + 2);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_648,
             (CPubKey *)&local_628);
  ppVar8 = &CScript::operator<<(pCVar7,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &local_648)->super_CScriptBase;
  uVar1 = ppVar8->_size;
  uVar4 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar4 = uVar1;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar8->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar9 = ppVar8;
  }
  local_6f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x53;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar9->_union + (long)(int)uVar4),(uchar *)&local_6f0);
  uVar1 = ppVar8->_size;
  uVar4 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar4 = uVar1;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (ppVar8->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar9 = ppVar8;
  }
  local_6f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar8,(uchar *)((long)&ppVar9->_union + (long)(int)uVar4),(uchar *)&local_6f0);
  if (local_648._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_648._M_dataplus._M_p,
                    local_648.field_2._M_allocated_capacity - (long)local_648._M_dataplus._M_p);
  }
  if ((_func_int **)local_710._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_710._0_8_,(long)local_700 - local_710._0_8_);
  }
  if (local_6b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_6b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_6b0.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  CMutableTransaction::CMutableTransaction(&local_6b0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&local_6b0.vout,3);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((local_6b0.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_128);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&local_6b0.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&local_6b0.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[2].scriptPubKey.super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  lVar6 = 0;
  do {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)(local_218 + lVar6));
    lVar6 = lVar6 + 0x38;
  } while (lVar6 != 0xa8);
  lVar6 = 0;
  do {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in,1);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)(in + 0x18),1);
    *(int *)(*(long *)in + 0x20) = (int)lVar6;
    CMutableTransaction::GetHash((Txid *)local_5a8,&local_6b0);
    puVar2 = *(ulong **)in;
    puVar2[2] = local_5a8._16_8_;
    puVar2[3] = local_5a8._24_8_;
    *puVar2 = local_5a8._0_8_;
    puVar2[1] = CONCAT71(local_5a8._9_7_,local_5a8[8]);
    **(undefined8 **)(in + 0x18) = 1;
    lVar6 = lVar6 + 1;
    in = in + 0x38;
  } while (lVar6 != 3);
  local_6b4 = 0;
  do {
    local_5a8._0_8_ = local_5a8._0_8_ & 0xffffffffffff0000;
    local_4e0._M_color = _S_red;
    local_4e0._M_parent = (_Base_ptr)0x0;
    memset(local_5a8 + 8,0,0xb8);
    local_4e0._M_left = &local_4e0;
    local_4c0 = 0;
    local_450 = false;
    local_440._M_color = _S_red;
    local_440._M_parent = (_Base_ptr)0x0;
    local_440._M_left = &local_440;
    local_420 = 0;
    local_410._M_color = _S_red;
    local_410._M_parent = (_Base_ptr)0x0;
    local_410._M_left = &local_410;
    local_3c8._M_color = _S_red;
    local_3c8._M_parent = (_Base_ptr)0x0;
    local_3f0 = 0;
    puStack_3e8 = (pointer)0x0;
    local_3e0 = (pointer)0x0;
    puStack_3d8 = (pointer)0x0;
    local_3c8._M_left = &local_3c8;
    local_3a8 = 0;
    local_398._M_color = _S_red;
    local_398._M_parent = (_Base_ptr)0x0;
    local_398._M_left = &local_398;
    local_378 = 0;
    local_368._M_color = _S_red;
    local_368._M_parent = (_Base_ptr)0x0;
    local_368._M_left = &local_368;
    local_2d0._M_color = _S_red;
    local_2d0._M_parent = (_Base_ptr)0x0;
    local_348 = 0;
    pCStack_340 = (pointer)0x0;
    local_338 = (pointer)0x0;
    pCStack_330 = (pointer)0x0;
    local_328 = (pointer)0x0;
    pCStack_320 = (pointer)0x0;
    local_318 = (pointer)0x0;
    auStack_310[0] = '\0';
    auStack_310[1] = '\0';
    auStack_310[2] = '\0';
    auStack_310[3] = '\0';
    auStack_310[4] = '\0';
    auStack_310[5] = '\0';
    auStack_310[6] = '\0';
    auStack_310[7] = '\0';
    auStack_310[8] = '\0';
    auStack_310[9] = '\0';
    auStack_310[10] = '\0';
    auStack_310[0xb] = '\0';
    auStack_310[0xc] = '\0';
    auStack_310[0xd] = '\0';
    auStack_310[0xe] = '\0';
    auStack_310[0xf] = '\0';
    auStack_310[0x10] = '\0';
    auStack_310[0x11] = '\0';
    auStack_310[0x12] = '\0';
    auStack_310[0x13] = '\0';
    auStack_310[0x14] = '\0';
    auStack_310[0x15] = '\0';
    auStack_310[0x16] = '\0';
    auStack_310[0x17] = '\0';
    auStack_310[0x18] = '\0';
    auStack_310[0x19] = '\0';
    auStack_310[0x1a] = '\0';
    auStack_310[0x1b] = '\0';
    auStack_310[0x1c] = '\0';
    auStack_310[0x1d] = '\0';
    auStack_310[0x1e] = '\0';
    auStack_310[0x1f] = '\0';
    auStack_310[0x20] = '\0';
    auStack_310[0x21] = '\0';
    auStack_310[0x22] = '\0';
    auStack_310[0x23] = '\0';
    auStack_310[0x24] = '\0';
    auStack_310[0x25] = '\0';
    auStack_310[0x26] = '\0';
    auStack_310[0x27] = '\0';
    auStack_310[0x28] = '\0';
    auStack_310[0x29] = '\0';
    auStack_310[0x2a] = '\0';
    auStack_310[0x2b] = '\0';
    auStack_310[0x2c] = '\0';
    auStack_310[0x2d] = '\0';
    auStack_310[0x2e] = '\0';
    auStack_310[0x2f] = '\0';
    auStack_310[0x30] = '\0';
    auStack_310[0x31] = '\0';
    auStack_310[0x32] = '\0';
    auStack_310[0x33] = '\0';
    local_2d0._M_left = &local_2d0;
    local_2b0 = 0;
    local_2a0._M_color = _S_red;
    local_2a0._M_parent = (_Base_ptr)0x0;
    local_2a0._M_left = &local_2a0;
    local_280 = 0;
    local_270._M_color = _S_red;
    local_270._M_parent = (_Base_ptr)0x0;
    local_270._M_left = &local_270;
    local_250 = 0;
    local_240._M_color = _S_red;
    local_240._M_parent = (_Base_ptr)0x0;
    local_220 = 0;
    local_6c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_6c0 = "";
    local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0xdd;
    file_00.m_begin = (iterator)&local_6c8;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    local_4e0._M_right = local_4e0._M_left;
    local_440._M_right = local_440._M_left;
    local_410._M_right = local_410._M_left;
    local_3c8._M_right = local_3c8._M_left;
    local_398._M_right = local_398._M_left;
    local_368._M_right = local_368._M_left;
    local_2d0._M_right = local_2d0._M_left;
    local_2a0._M_right = local_2a0._M_left;
    local_270._M_right = local_270._M_left;
    local_240._M_left = &local_240;
    local_240._M_right = &local_240;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_6d8,
               msg_00);
    CTransaction::CTransaction(&local_628,&local_6b0);
    local_6f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         SignSignature(&local_c8,&local_628,
                       (CMutableTransaction *)(local_218 + (long)local_6b4 * 0x38),0,1,
                       (SignatureData *)local_5a8);
    local_6f0.m_message.px = (element_type *)0x0;
    local_6f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    tinyformat::format<int>(&local_648,"SignSignature %d",&local_6b4);
    local_710[8] = false;
    local_710._0_8_ = &PTR__lazy_ostream_013d3bb0;
    local_700 = boost::unit_test::lazy_ostream::inst;
    local_720 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/multisig_tests.cpp"
    ;
    local_718 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x1;
    local_6f8 = &local_648;
    boost::test_tools::tt_detail::report_assertion
              (&local_6f0,(lazy_ostream *)local_710,1,1,WARN,_cVar11,(size_t)&local_720,0xdd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._M_dataplus._M_p != &local_648.field_2) {
      operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
    }
    boost::detail::shared_count::~shared_count(&local_6f0.m_message.pn);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_628.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_628.vin);
    SignatureData::~SignatureData((SignatureData *)local_5a8);
    iVar5 = local_6b4 + 1;
    bVar3 = local_6b4 < 2;
    local_6b4 = iVar5;
  } while (bVar3);
  lVar6 = -0xa8;
  this_00 = local_190;
  do {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)this_00);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)(this_00 + -3));
    this_00 = this_00 + -7;
    lVar6 = lVar6 + 0x38;
  } while (lVar6 != 0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_6b0.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_6b0.vin);
  if (0x1c < uStack_14c) {
    free((void *)local_168._0_8_);
    local_168._0_8_ = (char *)0x0;
  }
  if (0x1c < uStack_12c) {
    free((void *)local_148._0_8_);
    local_148._0_8_ = (char *)0x0;
  }
  if (0x1c < uStack_10c) {
    free((void *)local_128._0_8_);
    local_128._0_8_ = (char *)0x0;
  }
  lVar6 = 0x38;
  do {
    if (*(array<unsigned_char,_32UL> **)(&local_108[0].fCompressed + lVar6) !=
        (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)
                 (&local_108[0].fCompressed + lVar6),
                 *(array<unsigned_char,_32UL> **)(&local_108[0].fCompressed + lVar6));
    }
    *(undefined8 *)(&local_108[0].fCompressed + lVar6) = 0;
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != -8);
  local_c8._vptr_SigningProvider = (_func_int **)&PTR__FillableSigningProvider_013e4e20;
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(multisig_Sign)
{
    // Test SignSignature() (and therefore the version of Solver() that signs transactions)
    FillableSigningProvider keystore;
    CKey key[4];
    for (int i = 0; i < 4; i++)
    {
        key[i].MakeNewKey(true);
        BOOST_CHECK(keystore.AddKey(key[i]));
    }

    CScript a_and_b;
    a_and_b << OP_2 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    CScript a_or_b;
    a_or_b  << OP_1 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    CScript escrow;
    escrow << OP_2 << ToByteVector(key[0].GetPubKey()) << ToByteVector(key[1].GetPubKey()) << ToByteVector(key[2].GetPubKey()) << OP_3 << OP_CHECKMULTISIG;

    CMutableTransaction txFrom;  // Funding transaction
    txFrom.vout.resize(3);
    txFrom.vout[0].scriptPubKey = a_and_b;
    txFrom.vout[1].scriptPubKey = a_or_b;
    txFrom.vout[2].scriptPubKey = escrow;

    CMutableTransaction txTo[3]; // Spending transaction
    for (int i = 0; i < 3; i++)
    {
        txTo[i].vin.resize(1);
        txTo[i].vout.resize(1);
        txTo[i].vin[0].prevout.n = i;
        txTo[i].vin[0].prevout.hash = txFrom.GetHash();
        txTo[i].vout[0].nValue = 1;
    }

    for (int i = 0; i < 3; i++)
    {
        SignatureData empty;
        BOOST_CHECK_MESSAGE(SignSignature(keystore, CTransaction(txFrom), txTo[i], 0, SIGHASH_ALL, empty), strprintf("SignSignature %d", i));
    }
}